

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_base.h
# Opt level: O2

void __thiscall
draco::EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>::Reset
          (EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_> *this)

{
  EncoderOptionsBase<draco::GeometryAttribute::Type> local_a0;
  
  EncoderOptionsBase<draco::GeometryAttribute::Type>::CreateDefaultOptions();
  EncoderOptionsBase<draco::GeometryAttribute::Type>::operator=(&this->options_,&local_a0);
  EncoderOptionsBase<draco::GeometryAttribute::Type>::~EncoderOptionsBase(&local_a0);
  return;
}

Assistant:

void Reset() { options_ = EncoderOptionsT::CreateDefaultOptions(); }